

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_txn_state(sqlite3 *db,char *zSchema)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Btree **ppBVar4;
  uint uVar5;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (zSchema == (char *)0x0) {
    iVar3 = db->nDb + -1;
    iVar1 = 0;
  }
  else {
    iVar1 = sqlite3FindDbName(db,zSchema);
    iVar3 = (iVar1 >> 0x1f) + iVar1;
  }
  uVar5 = 0xffffffff;
  if (iVar1 <= iVar3) {
    ppBVar4 = &db->aDb[iVar1].pBt;
    iVar1 = (iVar3 - iVar1) + 1;
    do {
      if (*ppBVar4 == (Btree *)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = (uint)(*ppBVar4)->inTrans;
      }
      if ((int)uVar5 < (int)uVar2) {
        uVar5 = uVar2;
      }
      ppBVar4 = ppBVar4 + 4;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return uVar5;
}

Assistant:

SQLITE_API int sqlite3_txn_state(sqlite3 *db, const char *zSchema){
  int iDb, nDb;
  int iTxn = -1;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return -1;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  if( zSchema ){
    nDb = iDb = sqlite3FindDbName(db, zSchema);
    if( iDb<0 ) nDb--;
  }else{
    iDb = 0;
    nDb = db->nDb-1;
  }
  for(; iDb<=nDb; iDb++){
    Btree *pBt = db->aDb[iDb].pBt;
    int x = pBt!=0 ? sqlite3BtreeTxnState(pBt) : SQLITE_TXN_NONE;
    if( x>iTxn ) iTxn = x;
  }
  sqlite3_mutex_leave(db->mutex);
  return iTxn;
}